

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_finished(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  long lVar1;
  ulong uVar2;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t local_40;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  ptls_message_emitter_t *ppStack_18;
  int ret;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  
  _buf = (ptls_buffer_t *)emitter;
  ppStack_18 = emitter;
  emitter_local = (ptls_message_emitter_t *)tls;
  _emitter._4_4_ = (*emitter->begin_message)(emitter);
  if (_emitter._4_4_ == 0) {
    _key_sched = (ptls_key_schedule_t *)_buf->base;
    mess_start = (size_t)emitter_local[2].buf;
    local_40 = *(size_t *)(_key_sched->secret + 0xc);
    capacity._7_1_ = 0x14;
    _emitter._4_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
    if (_emitter._4_4_ == 0) {
      body_start = 3;
      _emitter._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
      if (_emitter._4_4_ == 0) {
        lVar1 = *(long *)(_key_sched->secret + 0xc);
        _emitter._4_4_ =
             ptls_buffer_reserve(ppStack_18->buf,*(size_t *)(emitter_local[2].buf[2].off + 0x10));
        if ((_emitter._4_4_ == 0) &&
           (_emitter._4_4_ =
                 calc_verify_data(ppStack_18->buf->base + ppStack_18->buf->off,
                                  (ptls_key_schedule_t *)emitter_local[2].buf,
                                  &emitter_local[4].commit_message), _emitter._4_4_ == 0)) {
          ppStack_18->buf->off =
               *(long *)(emitter_local[2].buf[2].off + 0x10) + ppStack_18->buf->off;
          uVar2 = *(long *)(_key_sched->secret + 0xc) - lVar1;
          if (uVar2 < 0x1000000) {
            for (; body_start != 0; body_start = body_start - 1) {
              *(char *)(*(long *)_key_sched + (lVar1 - body_start)) =
                   (char)(uVar2 >> (((char)body_start + -1) * '\b' & 0x3fU));
            }
            if (mess_start != 0) {
              ptls__key_schedule_update_hash
                        ((ptls_key_schedule_t *)mess_start,
                         (uint8_t *)(*(long *)_key_sched + local_40),
                         *(long *)(_key_sched->secret + 0xc) - local_40,0);
            }
            _emitter._4_4_ = (*(code *)_buf[1].base)(_buf);
          }
          else {
            _emitter._4_4_ = 0x20c;
          }
        }
      }
    }
  }
  return _emitter._4_4_;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                    tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}